

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O2

void vk::invalidateMappedMemoryRange
               (DeviceInterface *vkd,VkDevice device,VkDeviceMemory memory,VkDeviceSize offset,
               VkDeviceSize size)

{
  VkResult result;
  VkMappedMemoryRange range;
  
  range.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  range.pNext = (void *)0x0;
  range.memory.m_internal = memory.m_internal;
  range.offset = offset;
  range.size = size;
  result = (*vkd->_vptr_DeviceInterface[10])(vkd,device,1,&range);
  checkResult(result,"vkd.invalidateMappedMemoryRanges(device, 1u, &range)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
              ,0xee);
  return;
}

Assistant:

void invalidateMappedMemoryRange (const DeviceInterface& vkd, VkDevice device, VkDeviceMemory memory, VkDeviceSize offset, VkDeviceSize size)
{
	const VkMappedMemoryRange	range	=
	{
		VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
		DE_NULL,
		memory,
		offset,
		size
	};

	VK_CHECK(vkd.invalidateMappedMemoryRanges(device, 1u, &range));
}